

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O3

void Abc_AigDeleteNode(Abc_Aig_t *pMan,Abc_Obj_t *pNode)

{
  int iVar1;
  int *piVar2;
  Abc_Obj_t *pNode_00;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  
  do {
    if (((ulong)pNode & 1) != 0) {
      __assert_fail("!Abc_ObjIsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                    ,0x3d2,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
    }
    if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                    ,0x3d3,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
    }
    if ((pNode->vFanins).nSize != 2) {
      __assert_fail("Abc_ObjFaninNum(pNode) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                    ,0x3d4,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
    }
    if ((pNode->vFanouts).nSize != 0) {
      __assert_fail("Abc_ObjFanoutNum(pNode) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                    ,0x3d5,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
    }
    pVVar4 = pMan->vStackReplaceOld;
    uVar8 = (ulong)(uint)pVVar4->nSize;
    if (0 < pVVar4->nSize) {
      lVar6 = 0;
      do {
        if ((Abc_Obj_t *)pVVar4->pArray[lVar6] == pNode) {
          uVar7 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar7;
          lVar9 = lVar6;
          if (lVar6 < (int)uVar7) {
            do {
              pVVar4->pArray[lVar9] = pVVar4->pArray[lVar9 + 1];
              ppvVar5 = pMan->vStackReplaceNew->pArray;
              ppvVar5[lVar9] = ppvVar5[lVar9 + 1];
              lVar9 = lVar9 + 1;
              pVVar4 = pMan->vStackReplaceOld;
              uVar8 = (long)pVVar4->nSize - 1;
            } while (lVar9 < (long)uVar8);
          }
          pVVar4->nSize = (int)uVar8;
          piVar2 = &pMan->vStackReplaceNew->nSize;
          *piVar2 = *piVar2 + -1;
        }
        lVar6 = lVar6 + 1;
        uVar8 = (ulong)pVVar4->nSize;
      } while (lVar6 < (long)uVar8);
    }
    lVar6 = (long)pMan->vStackReplaceNew->nSize;
    if (0 < lVar6) {
      lVar9 = 0;
      do {
        if (pNode == (Abc_Obj_t *)
                     ((ulong)pMan->vStackReplaceNew->pArray[lVar9] & 0xfffffffffffffffe)) {
          return;
        }
        lVar9 = lVar9 + 1;
      } while (lVar6 != lVar9);
    }
    piVar2 = (pNode->vFanins).pArray;
    ppvVar5 = pNode->pNtk->vObjs->pArray;
    pNode_00 = (Abc_Obj_t *)ppvVar5[*piVar2];
    pAVar3 = (Abc_Obj_t *)ppvVar5[piVar2[1]];
    pVVar4 = pMan->vUpdatedNets;
    if (pVVar4 != (Vec_Ptr_t *)0x0) {
      uVar7 = pVVar4->nSize;
      if (0 < (int)uVar7) {
        uVar8 = 0;
        do {
          if ((Abc_Obj_t *)pVVar4->pArray[uVar8] == pNode_00) goto LAB_00838faa;
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      if (uVar7 == pVVar4->nCap) {
        if ((int)uVar7 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
        }
        else {
          sVar10 = (ulong)uVar7 << 4;
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(sVar10);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,sVar10);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = uVar7 * 2;
        }
      }
      else {
        ppvVar5 = pVVar4->pArray;
      }
      iVar1 = pVVar4->nSize;
      pVVar4->nSize = iVar1 + 1;
      ppvVar5[iVar1] = pNode_00;
      pVVar4 = pMan->vUpdatedNets;
      uVar7 = pVVar4->nSize;
LAB_00838faa:
      if (0 < (int)uVar7) {
        uVar8 = 0;
        do {
          if ((Abc_Obj_t *)pVVar4->pArray[uVar8] == pAVar3) goto LAB_0083903b;
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      if (uVar7 == pVVar4->nCap) {
        if ((int)uVar7 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
        }
        else {
          sVar10 = (ulong)(uVar7 * 2) * 8;
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(sVar10);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,sVar10);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = uVar7 * 2;
        }
      }
      else {
        ppvVar5 = pVVar4->pArray;
      }
      iVar1 = pVVar4->nSize;
      pVVar4->nSize = iVar1 + 1;
      ppvVar5[iVar1] = pAVar3;
    }
LAB_0083903b:
    Abc_AigAndDelete(pMan,pNode);
    uVar7 = *(uint *)&pNode->field_0x14;
    if ((uVar7 & 0x10) != 0) {
      Abc_AigRemoveFromLevelStructure(pMan->vLevels,pNode);
      uVar7 = *(uint *)&pNode->field_0x14;
    }
    if ((uVar7 & 0x20) != 0) {
      Abc_AigRemoveFromLevelStructureR(pMan->vLevelsR,pNode);
    }
    Abc_NtkDeleteObj(pNode);
    if (((*(uint *)&pNode_00->field_0x14 & 0xf) == 7) && ((pNode_00->vFanouts).nSize == 0)) {
      Abc_AigDeleteNode(pMan,pNode_00);
    }
    if (((*(uint *)&pAVar3->field_0x14 & 0xf) != 7) ||
       (pNode = pAVar3, (pAVar3->vFanouts).nSize != 0)) {
      return;
    }
  } while( true );
}

Assistant:

void Abc_AigDeleteNode( Abc_Aig_t * pMan, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode0, * pNode1, * pTemp;
    int i, k;

    // make sure the node is regular and dangling
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_ObjIsNode(pNode) );
    assert( Abc_ObjFaninNum(pNode) == 2 );
    assert( Abc_ObjFanoutNum(pNode) == 0 );

    // when deleting an old node that is scheduled for replacement, remove it from the replacement queue
    Vec_PtrForEachEntry( Abc_Obj_t *, pMan->vStackReplaceOld, pTemp, i )
        if ( pNode == pTemp )
        {
            // remove the entry from the replacement array
            for ( k = i; k < pMan->vStackReplaceOld->nSize - 1; k++ )
            {
                pMan->vStackReplaceOld->pArray[k] = pMan->vStackReplaceOld->pArray[k+1];
                pMan->vStackReplaceNew->pArray[k] = pMan->vStackReplaceNew->pArray[k+1];
            }
            pMan->vStackReplaceOld->nSize--;
            pMan->vStackReplaceNew->nSize--;
        }

    // when deleting a new node that should replace another node, do not delete
    Vec_PtrForEachEntry( Abc_Obj_t *, pMan->vStackReplaceNew, pTemp, i )
        if ( pNode == Abc_ObjRegular(pTemp) )
            return;

    // remember the node's fanins
    pNode0 = Abc_ObjFanin0( pNode );
    pNode1 = Abc_ObjFanin1( pNode );

    // add the node to the list of updated nodes
    if ( pMan->vUpdatedNets )
    {
        Vec_PtrPushUnique( pMan->vUpdatedNets, pNode0 );
        Vec_PtrPushUnique( pMan->vUpdatedNets, pNode1 );
    }

    // remove the node from the table
    Abc_AigAndDelete( pMan, pNode );
    // if the node is in the level structure, remove it
    if ( pNode->fMarkA )
        Abc_AigRemoveFromLevelStructure( pMan->vLevels, pNode );
    if ( pNode->fMarkB )
        Abc_AigRemoveFromLevelStructureR( pMan->vLevelsR, pNode );
    // remove the node from the network
    Abc_NtkDeleteObj( pNode );

    // call recursively for the fanins
    if ( Abc_ObjIsNode(pNode0) && pNode0->vFanouts.nSize == 0 )
        Abc_AigDeleteNode( pMan, pNode0 );
    if ( Abc_ObjIsNode(pNode1) && pNode1->vFanouts.nSize == 0 )
        Abc_AigDeleteNode( pMan, pNode1 );
}